

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall Liby::EventQueue::destroy(EventQueue *this)

{
  EventQueue *this_local;
  
  this->eventfd_ = -1;
  std::unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>::reset
            (&this->eventfp_,(pointer)0x0);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            (&this->eventChanelPtr_,(pointer)0x0);
  return;
}

Assistant:

void EventQueue::destroy() {
    eventfd_ = -1;
    eventfp_.reset();
#ifdef __APPLE__
    event2fd_ = -1;
    event2fp_.reset();
#endif
    eventChanelPtr_.reset();
}